

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O0

UStringTrieResult __thiscall icu_63::BytesTrie::current(BytesTrie *this)

{
  uint node_00;
  UStringTrieResult local_34;
  int32_t node;
  uint8_t *pos;
  BytesTrie *this_local;
  
  if (this->pos_ == (byte *)0x0) {
    this_local._4_4_ = USTRINGTRIE_NO_MATCH;
  }
  else {
    if ((this->remainingMatchLength_ < 0) && (node_00 = (uint)*this->pos_, 0x1f < node_00)) {
      local_34 = valueResult(node_00);
    }
    else {
      local_34 = USTRINGTRIE_NO_VALUE;
    }
    this_local._4_4_ = local_34;
  }
  return this_local._4_4_;
}

Assistant:

UStringTrieResult
BytesTrie::current() const {
    const uint8_t *pos=pos_;
    if(pos==NULL) {
        return USTRINGTRIE_NO_MATCH;
    } else {
        int32_t node;
        return (remainingMatchLength_<0 && (node=*pos)>=kMinValueLead) ?
                valueResult(node) : USTRINGTRIE_NO_VALUE;
    }
}